

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O2

void __thiscall
t_php_generator::generate_deserialize_struct
          (t_php_generator *this,ostream *out,t_struct *tstruct,string *prefix)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  string sStack_88;
  string local_68;
  string local_48;
  
  t_generator::indent_abi_cxx11_(&local_48,(t_generator *)this);
  poVar2 = std::operator<<(out,(string *)&local_48);
  poVar2 = std::operator<<(poVar2,"$");
  poVar2 = std::operator<<(poVar2,(string *)prefix);
  poVar2 = std::operator<<(poVar2," = new ");
  php_namespace_abi_cxx11_(&local_68,this,(tstruct->super_t_type).program_);
  poVar2 = std::operator<<(poVar2,(string *)&local_68);
  iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar2 = std::operator<<(poVar2,(string *)CONCAT44(extraout_var,iVar1));
  poVar2 = std::operator<<(poVar2,"();");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&sStack_88,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&sStack_88);
  poVar2 = std::operator<<(poVar2,"$xfer += $");
  poVar2 = std::operator<<(poVar2,(string *)prefix);
  poVar2 = std::operator<<(poVar2,"->read($input);");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void t_php_generator::generate_deserialize_struct(ostream& out, t_struct* tstruct, string prefix) {
  out << indent() << "$" << prefix << " = new " << php_namespace(tstruct->get_program())
      << tstruct->get_name() << "();" << endl << indent() << "$xfer += $" << prefix
      << "->read($input);" << endl;
}